

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void printTo<>(FILE *fp,String *fmtstr)

{
  pointer pcVar1;
  char *local_38 [2];
  char local_28 [16];
  
  pcVar1 = (fmtstr->_string)._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + (fmtstr->_string)._M_string_length);
  fputs(local_38[0],(FILE *)fp);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void printTo (FILE* fp, const String& fmtstr, const argtypes&... args)
{
	fprintf (fp, "%s", format (fmtstr, args...).c_str());
}